

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O0

void runPreIncludeFile(void)

{
  bool bVar1;
  uint32_t uVar2;
  int *piVar3;
  char *pcVar4;
  FileStackNode *fileInfo_00;
  char *pcVar5;
  LexerState *pLVar6;
  FileStackNamedNode *fileInfo;
  size_t size;
  char *fullPath;
  
  if (preIncludeName != (char *)0x0) {
    size = 0;
    fileInfo = (FileStackNamedNode *)0x0;
    bVar1 = fstk_FindFile(preIncludeName,(char **)&size,(size_t *)&fileInfo);
    if (bVar1) {
      fileInfo_00 = (FileStackNode *)malloc((size_t)(fileInfo + 1));
      if (fileInfo_00 == (FileStackNode *)0x0) {
        piVar3 = __errno_location();
        pcVar5 = strerror(*piVar3);
        error("Failed to alloc file info for pre-include: %s\n",pcVar5);
      }
      else {
        fileInfo_00->type = NODE_FILE;
        strcpy((char *)(fileInfo_00 + 1),(char *)size);
        free((void *)size);
        newContext(fileInfo_00);
        pLVar6 = lexer_OpenFile((char *)(fileInfo_00 + 1));
        contextStack->lexerState = pLVar6;
        if (contextStack->lexerState == (LexerState *)0x0) {
          fatalerror("Failed to set up lexer for file include\n");
        }
        lexer_SetState(contextStack->lexerState);
        uVar2 = macro_UndefUniqueID();
        contextStack->uniqueID = uVar2;
      }
    }
    else {
      free((void *)size);
      pcVar5 = preIncludeName;
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      error("Unable to open included file \'%s\': %s\n",pcVar5,pcVar4);
    }
  }
  return;
}

Assistant:

static void runPreIncludeFile(void)
{
	if (!preIncludeName)
		return;

	char *fullPath = NULL;
	size_t size = 0;

	if (!fstk_FindFile(preIncludeName, &fullPath, &size)) {
		free(fullPath);
		error("Unable to open included file '%s': %s\n", preIncludeName, strerror(errno));
		return;
	}

	struct FileStackNamedNode *fileInfo =
		(struct FileStackNamedNode *)malloc(sizeof(*fileInfo) + size);

	if (!fileInfo) {
		error("Failed to alloc file info for pre-include: %s\n", strerror(errno));
		return;
	}
	fileInfo->node.type = NODE_FILE;
	strcpy(fileInfo->name, fullPath);
	free(fullPath);

	newContext((struct FileStackNode *)fileInfo);
	contextStack->lexerState = lexer_OpenFile(fileInfo->name);
	if (!contextStack->lexerState)
		fatalerror("Failed to set up lexer for file include\n");
	lexer_SetState(contextStack->lexerState);
	// We're back at top-level, so most things are reset
	contextStack->uniqueID = macro_UndefUniqueID();
}